

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O2

uint64_t __thiscall
r_exec::HLPController::get_requirement_count
          (HLPController *this,uint64_t *weak_requirement_count,uint64_t *strong_requirement_count)

{
  mutex *__mutex;
  uint64_t uVar1;
  
  __mutex = &(this->super_OController).super_Controller.m_reductionMutex;
  std::mutex::lock(__mutex);
  uVar1 = this->requirement_count;
  *weak_requirement_count = this->weak_requirement_count;
  *strong_requirement_count = this->strong_requirement_count;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return uVar1;
}

Assistant:

uint64_t HLPController::get_requirement_count(uint64_t &weak_requirement_count, uint64_t &strong_requirement_count)
{
    uint64_t r_c;
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_c = requirement_count;
    weak_requirement_count = this->weak_requirement_count;
    strong_requirement_count = this->strong_requirement_count;
    return r_c;
}